

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::vprint(FILE *f,string_view format_str,format_args args)

{
  size_t *psVar1;
  undefined **local_238;
  memory_buffer buffer;
  
  psVar1 = &buffer.super_buffer<char>.capacity_;
  buffer.super_buffer<char>.ptr_ = (char *)0x0;
  local_238 = &PTR_grow_002c3bd0;
  buffer.super_buffer<char>.size_ = 500;
  buffer.super_buffer<char>._vptr_buffer = (_func_int **)psVar1;
  vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
            ((iterator)&local_238,format_str,
             args.
             super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             ,(locale_ref)0x0);
  detail::fwrite_fully
            (buffer.super_buffer<char>._vptr_buffer,1,(size_t)buffer.super_buffer<char>.ptr_,f);
  local_238 = &PTR_grow_002c3bd0;
  if (buffer.super_buffer<char>._vptr_buffer != (_func_int **)psVar1) {
    operator_delete(buffer.super_buffer<char>._vptr_buffer,buffer.super_buffer<char>.size_);
  }
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str,
                     basic_format_args<buffer_context<char>>(args));
#ifdef _WIN32
  auto fd = _fileno(f);
  if (_isatty(fd)) {
    detail::utf8_to_utf16 u16(string_view(buffer.data(), buffer.size()));
    auto written = DWORD();
    if (!WriteConsoleW(reinterpret_cast<HANDLE>(_get_osfhandle(fd)),
                       u16.c_str(), static_cast<DWORD>(u16.size()), &written,
                       nullptr)) {
      FMT_THROW(format_error("failed to write to console"));
    }
    return;
  }
#endif
  detail::fwrite_fully(buffer.data(), 1, buffer.size(), f);
}